

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMbuffer cm_buffer_dump_list(CManager_conflict cm)

{
  CMbuffer p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CMbuffer p_Var3;
  
  p_Var1 = cm->cm_buffer_list;
  iVar2 = puts("Known CM buffers are:");
  p_Var3 = (CMbuffer)CONCAT44(extraout_var,iVar2);
  for (; p_Var1 != (CMbuffer)0x0; p_Var1 = p_Var1->next) {
    iVar2 = printf("Buffer begin %p, size %zd, end %p\n",p_Var1->buffer,p_Var1->size,
                   (long)p_Var1->buffer + p_Var1->size);
    p_Var3 = (CMbuffer)CONCAT44(extraout_var_00,iVar2);
  }
  return p_Var3;
}

Assistant:

static CMbuffer
 cm_buffer_dump_list(CManager cm)
 {
     CMbuffer tmp = cm->cm_buffer_list;
     printf("Known CM buffers are:\n");
     while (tmp != NULL) {
	 printf("Buffer begin %p, size %zd, end %p\n",
		tmp->buffer, tmp->size, (char*)tmp->buffer + tmp->size);
	 tmp = tmp->next;
     }
     return NULL;
 }